

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

char * libj1939_addr2str(sockaddr_can *can)

{
  uint uVar1;
  if_nameindex *piVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  
  uVar1 = can->can_ifindex;
  if (uVar1 == 0) {
    pcVar5 = libj1939_addr2str::buf;
  }
  else {
    while( true ) {
      piVar2 = saved;
      fetch_names();
      ppcVar4 = &saved->if_name;
      while( true ) {
        if (((if_nameindex *)(ppcVar4 + -1))->if_index == 0) break;
        if (((if_nameindex *)(ppcVar4 + -1))->if_index == uVar1) {
          if (*ppcVar4 == (char *)0x0) goto LAB_001033c6;
          iVar3 = sprintf(libj1939_addr2str::buf,"%s:");
          goto LAB_001033de;
        }
        ppcVar4 = ppcVar4 + 2;
      }
      if (piVar2 == (if_nameindex *)0x0) break;
      libj1939_cleanup();
    }
LAB_001033c6:
    iVar3 = sprintf(libj1939_addr2str::buf,"#%i:",(ulong)(uint)can->can_ifindex);
LAB_001033de:
    pcVar5 = libj1939_addr2str::buf + iVar3;
  }
  if ((can->can_addr).j1939.name == 0) {
    if ((can->can_addr).j1939.addr == 0xff) {
      pcVar5[0] = '-';
      pcVar5[1] = '\0';
      pcVar5 = pcVar5 + 1;
    }
    else {
      iVar3 = sprintf(pcVar5,"%02x");
      pcVar5 = pcVar5 + iVar3;
    }
  }
  else {
    iVar3 = sprintf(pcVar5,"%016llx");
    pcVar5 = pcVar5 + iVar3;
    if ((can->can_addr).j1939.pgn == 0xee00) {
      iVar3 = sprintf(pcVar5,".%02x",(ulong)(can->can_addr).j1939.addr);
      pcVar5 = pcVar5 + iVar3;
    }
  }
  if ((can->can_addr).j1939.pgn < 0x40000) {
    sprintf(pcVar5,",%05x");
  }
  return libj1939_addr2str::buf;
}

Assistant:

const char *libj1939_addr2str(const struct sockaddr_can *can)
{
	char *str;
	static char buf[128];

	str = buf;
	if (can->can_ifindex) {
		const char *ifname;
		ifname = libj1939_ifnam(can->can_ifindex);
		if (!ifname)
			str += sprintf(str, "#%i:", can->can_ifindex);
		else
			str += sprintf(str, "%s:", ifname);
	}
	if (can->can_addr.j1939.name) {
		str += sprintf(str, "%016llx", (unsigned long long)can->can_addr.j1939.name);
		if (can->can_addr.j1939.pgn == J1939_PGN_ADDRESS_CLAIMED)
			str += sprintf(str, ".%02x", can->can_addr.j1939.addr);
	} else if (can->can_addr.j1939.addr <= 0xfe)
		str += sprintf(str, "%02x", can->can_addr.j1939.addr);
	else
		str += sprintf(str, "-");
	if (can->can_addr.j1939.pgn <= J1939_PGN_MAX)
		str += sprintf(str, ",%05x", can->can_addr.j1939.pgn);

	return buf;
}